

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitDestructuredValueOrInitializer
               (ParseNodePtr lhsElementNode,RegSlot rhsLocation,ParseNodePtr initializer,
               bool isNonPatternAssignmentTarget,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  RegSlot R0;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  
  R0 = rhsLocation;
  if (initializer != (ParseNodePtr)0x0) {
    R0 = FuncInfo::AcquireTmpRegister(funcInfo);
    this = &byteCodeGenerator->m_writer;
    labelID = Js::ByteCodeWriter::DefineLabel(this);
    labelID_00 = Js::ByteCodeWriter::DefineLabel(this);
    Js::ByteCodeWriter::BrReg2
              (this,BrSrEq_A,labelID,rhsLocation,funcInfo->undefinedConstantRegister);
    Js::ByteCodeWriter::Reg2(this,Ld_A,R0,rhsLocation);
    Js::ByteCodeWriter::Br(this,labelID_00);
    Js::ByteCodeWriter::MarkLabel(this,labelID);
    Emit(initializer,byteCodeGenerator,funcInfo,0,false,false);
    Js::ByteCodeWriter::Reg2(this,Ld_A_ReuseLoc,R0,initializer->location);
    FuncInfo::ReleaseLoc(funcInfo,initializer);
    Js::ByteCodeWriter::MarkLabel(this,labelID_00);
  }
  if (lhsElementNode->nop == knopObjectPattern) {
    EmitDestructuredObject(lhsElementNode,R0,byteCodeGenerator,funcInfo);
  }
  else if (lhsElementNode->nop == knopArrayPattern) {
    EmitDestructuredArray(lhsElementNode,R0,byteCodeGenerator,funcInfo);
  }
  else if (isNonPatternAssignmentTarget) {
    EmitAssignment((ParseNode *)0x0,lhsElementNode,R0,byteCodeGenerator,funcInfo);
  }
  else {
    EmitDestructuredElement(lhsElementNode,R0,byteCodeGenerator,funcInfo);
  }
  if (initializer != (ParseNodePtr)0x0) {
    FuncInfo::ReleaseTmpRegister(funcInfo,R0);
    return;
  }
  return;
}

Assistant:

void EmitDestructuredValueOrInitializer(ParseNodePtr lhsElementNode,
    Js::RegSlot rhsLocation,
    ParseNodePtr initializer,
    bool isNonPatternAssignmentTarget,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    // If we have initializer we need to see if the destructured value is undefined or not - if it is undefined we need to assign initializer

    Js::ByteCodeLabel useDefault = -1;
    Js::ByteCodeLabel end = -1;
    Js::RegSlot rhsLocationTmp = rhsLocation;

    if (initializer != nullptr)
    {
        rhsLocationTmp = funcInfo->AcquireTmpRegister();

        useDefault = byteCodeGenerator->Writer()->DefineLabel();
        end = byteCodeGenerator->Writer()->DefineLabel();

        byteCodeGenerator->Writer()->BrReg2(Js::OpCode::BrSrEq_A, useDefault, rhsLocation, funcInfo->undefinedConstantRegister);
        byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, rhsLocationTmp, rhsLocation);

        byteCodeGenerator->Writer()->Br(end);
        byteCodeGenerator->Writer()->MarkLabel(useDefault);

        Emit(initializer, byteCodeGenerator, funcInfo, false/*isConstructorCall*/);
        byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, rhsLocationTmp, initializer->location);
        funcInfo->ReleaseLoc(initializer);

        byteCodeGenerator->Writer()->MarkLabel(end);
    }

    if (lhsElementNode->nop == knopArrayPattern)
    {
        EmitDestructuredArray(lhsElementNode, rhsLocationTmp, byteCodeGenerator, funcInfo);
    }
    else if (lhsElementNode->nop == knopObjectPattern)
    {
        EmitDestructuredObject(lhsElementNode, rhsLocationTmp, byteCodeGenerator, funcInfo);
    }
    else if (isNonPatternAssignmentTarget)
    {
        EmitAssignment(nullptr, lhsElementNode, rhsLocationTmp, byteCodeGenerator, funcInfo);
    }
    else
    {
        EmitDestructuredElement(lhsElementNode, rhsLocationTmp, byteCodeGenerator, funcInfo);
    }

    if (initializer != nullptr)
    {
        funcInfo->ReleaseTmpRegister(rhsLocationTmp);
    }
}